

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextTests.cpp
# Opt level: O2

void __thiscall
solitaire::ContextTests_throwOnInvalidFoundationPileColliderId_Test::TestBody
          (ContextTests_throwOnInvalidFoundationPileColliderId_Test *this)

{
  bool bVar1;
  AssertHelper local_70;
  char *local_68;
  undefined8 local_60;
  char local_58 [16];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48 [4];
  undefined4 local_28;
  undefined4 local_24;
  
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_60 = 0;
  local_68 = local_58;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_24 = 4;
    (*(((this->super_ContextTests).context._M_t.
        super___uniq_ptr_impl<solitaire::Context,_std::default_delete<solitaire::Context>_>._M_t.
        super__Tuple_impl<0UL,_solitaire::Context_*,_std::default_delete<solitaire::Context>_>.
        super__Head_base<0UL,_solitaire::Context_*,_false>._M_head_impl)->super_Context).
      _vptr_Context[6])();
  }
  std::__cxx11::string::assign((char *)&local_68);
  testing::Message::Message((Message *)local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ContextTests.cpp"
             ,0x53,local_68);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_48[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48[0]._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&local_68);
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_60 = 0;
  local_68 = local_58;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_28 = 4;
    (*(((this->super_ContextTests).context._M_t.
        super___uniq_ptr_impl<solitaire::Context,_std::default_delete<solitaire::Context>_>._M_t.
        super__Tuple_impl<0UL,_solitaire::Context_*,_std::default_delete<solitaire::Context>_>.
        super__Head_base<0UL,_solitaire::Context_*,_false>._M_head_impl)->super_Context).
      _vptr_Context[7])();
  }
  std::__cxx11::string::assign((char *)&local_68);
  testing::Message::Message((Message *)local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ContextTests.cpp"
             ,0x58,local_68);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_48[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48[0]._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

TEST_F(ContextTests, throwOnInvalidFoundationPileColliderId) {
    EXPECT_THROW(
        context->getFoundationPileCollider(PileId {foundationPilesCount}),
        std::runtime_error
    );

    EXPECT_THROW(
        std::as_const(*context).getFoundationPileCollider(PileId {foundationPilesCount}),
        std::runtime_error
    );
}